

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

void Addr_ESI(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  int iVar1;
  ulong MyNumber_00;
  size_t sVar2;
  long local_28;
  size_t i;
  long MyNumber;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  local_28 = 0;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic,"(%");
    local_28 = 2;
  }
  pMyOperand->OpType = 0x30000;
  if ((pMyDisasm->Reserved_).AddressSize == 0x40) {
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy(pMyOperand->OpMnemonic + local_28,Registers64Bits[0xe]);
      (pMyOperand->Memory).BaseRegister = REGS[0xe];
    }
    else {
      strcpy(pMyOperand->OpMnemonic + local_28,Registers64Bits[6]);
      (pMyOperand->Memory).BaseRegister = REGS[6];
    }
  }
  else if ((pMyDisasm->Reserved_).AddressSize == 0x20) {
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy(pMyOperand->OpMnemonic + local_28,Registers32Bits[0xe]);
      (pMyOperand->Memory).BaseRegister = REGS[0xe];
    }
    else {
      strcpy(pMyOperand->OpMnemonic + local_28,Registers32Bits[6]);
      (pMyOperand->Memory).BaseRegister = REGS[6];
    }
  }
  else {
    (pMyDisasm->Reserved_).DECALAGE_EIP = (pMyDisasm->Reserved_).DECALAGE_EIP + 2;
    iVar1 = Security(4,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    MyNumber_00 = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 2);
    (pMyOperand->Memory).Displacement = MyNumber_00;
    CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + local_28,"%.4X",MyNumber_00);
  }
  sVar2 = strlen(pMyOperand->OpMnemonic);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic + sVar2,")");
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_ESI(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    long MyNumber;
    size_t i = 0;
    #ifndef BEA_LIGHT_DISASSEMBLY
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
        i += 2;
    }
     #endif
    pMyOperand->OpType = MEMORY_TYPE;
    if (GV.AddressSize == 64) {
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else if (GV.AddressSize == 32) {

        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else {
        GV.DECALAGE_EIP+=2;
        if (!Security(4, pMyDisasm)) return;
        MyNumber = *((UInt16*) (GV.EIP_+2));
        pMyOperand->Memory.Displacement = MyNumber;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+i,"%.4X", (Int64)MyNumber);
        #endif
    }
    #ifndef BEA_LIGHT_DISASSEMBLY
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
        i += 1;
    }
  #endif
}